

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O3

SPxId __thiscall
soplex::SPxDefaultRT<double>::selectEnter
          (SPxDefaultRT<double> *this,double *max,int param_2,bool param_3)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  long lVar6;
  double *pdVar7;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  DataKey DVar8;
  long lVar9;
  double *pdVar10;
  undefined4 in_register_00000014;
  uint uVar11;
  long lVar12;
  long lVar13;
  long in_FS_OFFSET;
  bool bVar14;
  ulong extraout_XMM0_Qb;
  double dVar15;
  SPxId enterId;
  uint local_104;
  double local_100;
  DataKey local_e8;
  DataKey local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  double local_a8;
  ulong uStack_a0;
  double local_98;
  undefined8 uStack_90;
  long local_80;
  double local_78;
  ulong uStack_70;
  double local_68;
  ulong uStack_60;
  double *local_50;
  double local_48;
  undefined8 uStack_40;
  
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])
                    (this,max,CONCAT44(in_register_00000014,param_2));
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var,iVar4) + 0x6b8) + 0x20));
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var_00,iVar4) + 0x6c0) + 0x20));
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_d8 = **(long **)(CONCAT44(extraout_var_01,iVar4) + 0x6c0);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_80 = *(long *)(*(long *)(CONCAT44(extraout_var_02,iVar4) + 0x6c0) + 0x40);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar9 = *(long *)(CONCAT44(extraout_var_03,iVar4) + 0x6c0);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_c0 = **(long **)(CONCAT44(extraout_var_04,iVar4) + 0x6e0);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_c8 = **(long **)(CONCAT44(extraout_var_05,iVar4) + 0x6d8);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_d0 = **(long **)(CONCAT44(extraout_var_06,iVar4) + 0x6b8);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar6 = *(long *)(*(long *)(CONCAT44(extraout_var_07,iVar4) + 0x6b8) + 0x40);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar2 = *(long *)(CONCAT44(extraout_var_08,iVar4) + 0x6b8);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_b0 = **(long **)(CONCAT44(extraout_var_09,iVar4) + 0x6f0);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_b8 = **(long **)(CONCAT44(extraout_var_10,iVar4) + 0x6e8);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_a8 = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var_11,iVar4) + 0x1b8));
  local_100 = *max;
  local_e0.info = 0;
  local_e0.idx = -1;
  uStack_a0 = extraout_XMM0_Qb;
  local_50 = max;
  if (local_100 <= 0.0) {
    if (*(int *)(lVar9 + 0x28) < 1) {
      local_e8.info = 0;
      local_e8.idx = 0;
      local_104 = 0xffffffff;
    }
    else {
      local_78 = -local_a8;
      uStack_70 = extraout_XMM0_Qb ^ 0x8000000000000000;
      local_98 = *(double *)(in_FS_OFFSET + -8);
      uStack_90 = 0;
      local_68 = -local_98;
      uStack_60 = 0x8000000000000000;
      local_104 = 0xffffffff;
      local_e8.info = 0;
      local_e8.idx = 0;
      lVar12 = 0;
      do {
        iVar4 = *(int *)(*(long *)(lVar9 + 0x30) + lVar12 * 4);
        lVar13 = (long)iVar4;
        dVar1 = *(double *)(local_80 + lVar13 * 8);
        if (dVar1 <= local_a8) {
          if ((dVar1 < local_78) &&
             (dVar15 = *(double *)(local_c8 + lVar13 * 8), ::soplex::infinity::__tls_init(),
             dVar15 < local_98)) {
            dVar15 = (*(double *)(local_c8 + lVar13 * 8) - *(double *)(local_d8 + lVar13 * 8)) +
                     (this->super_SPxRatioTester<double>).delta;
            goto LAB_00210ee5;
          }
        }
        else {
          dVar15 = *(double *)(local_c0 + lVar13 * 8);
          ::soplex::infinity::__tls_init();
          if (local_68 < dVar15) {
            dVar15 = (*(double *)(local_c0 + lVar13 * 8) - *(double *)(local_d8 + lVar13 * 8)) -
                     (this->super_SPxRatioTester<double>).delta;
LAB_00210ee5:
            if (local_100 < dVar15 / dVar1) {
              iVar5 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
              local_e8 = (DataKey)SPxSolverBase<double>::id
                                            ((SPxSolverBase<double> *)
                                             CONCAT44(extraout_var_13,iVar5),iVar4);
              local_104 = (uint)lVar12;
              local_100 = dVar15 / dVar1;
              local_e0 = local_e8;
            }
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < *(int *)(lVar9 + 0x28));
    }
    if (*(int *)(lVar2 + 0x28) < 1) {
      uVar11 = 0xffffffff;
    }
    else {
      local_78 = -local_a8;
      uStack_70 = uStack_a0 ^ 0x8000000000000000;
      local_48 = *(double *)(in_FS_OFFSET + -8);
      uStack_40 = 0;
      local_68 = -local_48;
      uStack_60 = 0x8000000000000000;
      local_98 = (double)CONCAT44(local_98._4_4_,0xffffffff);
      lVar12 = 0;
      do {
        iVar4 = *(int *)(*(long *)(lVar2 + 0x30) + lVar12 * 4);
        lVar13 = (long)iVar4;
        dVar1 = *(double *)(lVar6 + lVar13 * 8);
        if (dVar1 <= local_a8) {
          if ((dVar1 < local_78) &&
             (dVar15 = *(double *)(local_b8 + lVar13 * 8), ::soplex::infinity::__tls_init(),
             dVar15 < local_48)) {
            dVar15 = (*(double *)(local_b8 + lVar13 * 8) - *(double *)(local_d0 + lVar13 * 8)) +
                     (this->super_SPxRatioTester<double>).delta;
            goto LAB_0021122c;
          }
        }
        else {
          dVar15 = *(double *)(local_b0 + lVar13 * 8);
          ::soplex::infinity::__tls_init();
          if (local_68 < dVar15) {
            dVar15 = (*(double *)(local_b0 + lVar13 * 8) - *(double *)(local_d0 + lVar13 * 8)) -
                     (this->super_SPxRatioTester<double>).delta;
LAB_0021122c:
            if (local_100 < dVar15 / dVar1) {
              iVar5 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
              local_e8 = (DataKey)SPxSolverBase<double>::coId
                                            ((SPxSolverBase<double> *)
                                             CONCAT44(extraout_var_15,iVar5),iVar4);
              local_98 = (double)CONCAT44(local_98._4_4_,(int)lVar12);
              local_100 = dVar15 / dVar1;
              local_e0 = local_e8;
            }
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < *(int *)(lVar2 + 0x28));
      uVar11 = local_98._0_4_;
      if (-1 < (int)local_98._0_4_) {
        lVar9 = (long)*(int *)(*(long *)(lVar2 + 0x30) + ((ulong)local_98 & 0xffffffff) * 4);
        local_100 = *(double *)(lVar6 + lVar9 * 8);
        bVar3 = local_a8 == local_100;
        bVar14 = local_a8 < local_100;
        goto LAB_00211291;
      }
    }
    if ((int)local_104 < 0) goto LAB_0021133a;
    lVar9 = (long)*(int *)(*(long *)(lVar9 + 0x30) + (ulong)local_104 * 4);
    local_100 = *(double *)(local_80 + lVar9 * 8);
    bVar3 = local_a8 == local_100;
    bVar14 = local_a8 < local_100;
LAB_00211310:
    lVar6 = local_c0;
    if (!bVar14 && !bVar3) {
      lVar6 = local_c8;
    }
    pdVar7 = (double *)(lVar6 + lVar9 * 8);
    pdVar10 = (double *)(local_d8 + lVar9 * 8);
  }
  else {
    if (*(int *)(lVar9 + 0x28) < 1) {
      local_e8.info = 0;
      local_e8.idx = 0;
      local_104 = 0xffffffff;
    }
    else {
      local_68 = -local_a8;
      uStack_60 = extraout_XMM0_Qb ^ 0x8000000000000000;
      local_78 = *(double *)(in_FS_OFFSET + -8);
      uStack_70 = 0;
      local_98 = -local_78;
      uStack_90 = 0x8000000000000000;
      local_104 = 0xffffffff;
      local_e8.info = 0;
      local_e8.idx = 0;
      lVar12 = 0;
      do {
        iVar4 = *(int *)(*(long *)(lVar9 + 0x30) + lVar12 * 4);
        lVar13 = (long)iVar4;
        dVar1 = *(double *)(local_80 + lVar13 * 8);
        if (dVar1 <= local_a8) {
          if ((dVar1 < local_68) &&
             (dVar15 = *(double *)(local_c0 + lVar13 * 8), ::soplex::infinity::__tls_init(),
             local_98 < dVar15)) {
            dVar15 = (*(double *)(local_c0 + lVar13 * 8) - *(double *)(local_d8 + lVar13 * 8)) -
                     (this->super_SPxRatioTester<double>).delta;
            goto LAB_00210d59;
          }
        }
        else {
          dVar15 = *(double *)(local_c8 + lVar13 * 8);
          ::soplex::infinity::__tls_init();
          if (dVar15 < local_78) {
            dVar15 = (*(double *)(local_c8 + lVar13 * 8) - *(double *)(local_d8 + lVar13 * 8)) +
                     (this->super_SPxRatioTester<double>).delta;
LAB_00210d59:
            if (dVar15 / dVar1 < local_100) {
              iVar5 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
              local_e8 = (DataKey)SPxSolverBase<double>::id
                                            ((SPxSolverBase<double> *)
                                             CONCAT44(extraout_var_12,iVar5),iVar4);
              local_104 = (uint)lVar12;
              local_100 = dVar15 / dVar1;
              local_e0 = local_e8;
            }
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < *(int *)(lVar9 + 0x28));
    }
    if (*(int *)(lVar2 + 0x28) < 1) {
      uVar11 = 0xffffffff;
LAB_002112b5:
      if ((int)local_104 < 0) goto LAB_0021133a;
      lVar9 = (long)*(int *)(*(long *)(lVar9 + 0x30) + (ulong)local_104 * 4);
      local_100 = *(double *)(local_80 + lVar9 * 8);
      bVar3 = local_100 == local_a8;
      bVar14 = local_100 < local_a8;
      goto LAB_00211310;
    }
    local_68 = -local_a8;
    uStack_60 = uStack_a0 ^ 0x8000000000000000;
    local_78 = *(double *)(in_FS_OFFSET + -8);
    uStack_70 = 0;
    local_48 = -local_78;
    uStack_40 = 0x8000000000000000;
    local_98 = (double)CONCAT44(local_98._4_4_,0xffffffff);
    lVar12 = 0;
    do {
      iVar4 = *(int *)(*(long *)(lVar2 + 0x30) + lVar12 * 4);
      lVar13 = (long)iVar4;
      dVar1 = *(double *)(lVar6 + lVar13 * 8);
      if (dVar1 <= local_a8) {
        if ((dVar1 < local_68) &&
           (dVar15 = *(double *)(local_b0 + lVar13 * 8), ::soplex::infinity::__tls_init(),
           local_48 < dVar15)) {
          dVar15 = (*(double *)(local_b0 + lVar13 * 8) - *(double *)(local_d0 + lVar13 * 8)) -
                   (this->super_SPxRatioTester<double>).delta;
          goto LAB_00211076;
        }
      }
      else {
        dVar15 = *(double *)(local_b8 + lVar13 * 8);
        ::soplex::infinity::__tls_init();
        if (dVar15 < local_78) {
          dVar15 = (*(double *)(local_b8 + lVar13 * 8) - *(double *)(local_d0 + lVar13 * 8)) +
                   (this->super_SPxRatioTester<double>).delta;
LAB_00211076:
          if (dVar15 / dVar1 < local_100) {
            iVar5 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
            local_e8 = (DataKey)SPxSolverBase<double>::coId
                                          ((SPxSolverBase<double> *)CONCAT44(extraout_var_14,iVar5),
                                           iVar4);
            local_98 = (double)CONCAT44(local_98._4_4_,(int)lVar12);
            local_100 = dVar15 / dVar1;
            local_e0 = local_e8;
          }
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < *(int *)(lVar2 + 0x28));
    uVar11 = local_98._0_4_;
    if ((int)local_98._0_4_ < 0) goto LAB_002112b5;
    lVar9 = (long)*(int *)(*(long *)(lVar2 + 0x30) + ((ulong)local_98 & 0xffffffff) * 4);
    local_100 = *(double *)(lVar6 + lVar9 * 8);
    bVar3 = local_100 == local_a8;
    bVar14 = local_100 < local_a8;
LAB_00211291:
    lVar6 = local_b0;
    if (!bVar14 && !bVar3) {
      lVar6 = local_b8;
    }
    pdVar7 = (double *)(lVar6 + lVar9 * 8);
    pdVar10 = (double *)(local_d0 + lVar9 * 8);
    uVar11 = local_98._0_4_;
  }
  local_100 = (*pdVar7 - *pdVar10) / local_100;
LAB_0021133a:
  if (local_e8.info != 0) {
    iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
    bVar3 = SPxSolverBase<double>::isBasic
                      ((SPxSolverBase<double> *)CONCAT44(extraout_var_16,iVar4),(SPxId *)&local_e0);
    if (bVar3) {
      lVar9 = 0x6b8;
      if ((-1 < (int)uVar11) || (lVar9 = 0x6c0, uVar11 = local_104, -1 < (int)local_104)) {
        iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
        lVar9 = *(long *)(CONCAT44(extraout_var_17,iVar4) + lVar9);
        lVar6 = *(long *)(lVar9 + 0x30);
        *(undefined8 *)(*(long *)(lVar9 + 0x40) + (long)*(int *)(lVar6 + (ulong)uVar11 * 4) * 8) = 0
        ;
        iVar4 = *(int *)(lVar9 + 0x28);
        *(int *)(lVar9 + 0x28) = iVar4 + -1;
        *(undefined4 *)(lVar6 + (ulong)uVar11 * 4) = *(undefined4 *)(lVar6 + -4 + (long)iVar4 * 4);
      }
      DVar8 = (DataKey)selectEnter(this,local_50,0,false);
      return (SPxId)DVar8;
    }
  }
  *local_50 = local_100;
  return (SPxId)local_e0;
}

Assistant:

SPxId SPxDefaultRT<R>::selectEnter(R& max, int, bool)
{
   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   const R*   pvec = this->solver()->pVec().get_const_ptr();
   const R*   pupd = this->solver()->pVec().delta().values();
   const IdxSet& pidx = this->solver()->pVec().idx();
   const R*   lpb  = this->solver()->lpBound().get_const_ptr();
   const R*   upb  = this->solver()->upBound().get_const_ptr();

   const R*   cvec = this->solver()->coPvec().get_const_ptr();
   const R*   cupd = this->solver()->coPvec().delta().values();
   const IdxSet& cidx = this->solver()->coPvec().idx();
   const R*   lcb  = this->solver()->lcBound().get_const_ptr();
   const R*   ucb  = this->solver()->ucBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   R val     = max;
   int  pnum    = -1;
   int  cnum    = -1;

   SPxId enterId;
   int   i;
   int   j;
   R  x;

   // PARALLEL the j loops could be parallelized
   if(val > 0)
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x > epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x > epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }
   else
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x < epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x < epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }

   if(enterId.isValid() && this->solver()->isBasic(enterId))
   {
      SPxOut::debug(this, "DDEFRT01 isValid() && isBasic(): max={}\n", max);

      if(cnum >= 0)
         this->solver()->coPvec().delta().clearNum(cnum);
      else if(pnum >= 0)
         this->solver()->pVec().delta().clearNum(pnum);

      return SPxDefaultRT<R>::selectEnter(max, 0, false);
   }

   SPX_DEBUG(

      if(!enterId.isValid())
      std::cout << "DDEFRT02 !isValid(): max=" << max << ", x=" << x << std::endl;
   )
      max = val;

   return enterId;
}